

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O0

bool __thiscall mau::DeliveryChannel::Initialize(DeliveryChannel *this,DeliveryCommonData *common)

{
  bool bVar1;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *this_00;
  undefined8 in_RSI;
  LockedValue<MauChannelConfig_t> *in_RDI;
  uint64_t seed;
  io_context *in_stack_ffffffffffffff58;
  __shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff60;
  uint64_t in_stack_ffffffffffffff68;
  undefined1 local_88 [12];
  uint local_7c;
  ulong local_40;
  undefined1 local_11;
  element_type *local_10;
  undefined1 *local_8;
  
  *(undefined8 *)((long)&(in_RDI->TheLock).cs.super___recursive_mutex_base._M_mutex + 8) = in_RSI;
  LockedValue<MauChannelConfig_t>::Get(in_RDI);
  local_40 = (ulong)local_7c;
  if (local_40 == 0) {
    local_40 = GetRandomSeed();
  }
  PCGRandom::Seed((PCGRandom *)in_RDI,in_stack_ffffffffffffff68,(uint64_t)in_stack_ffffffffffffff60)
  ;
  local_10 = std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(in_stack_ffffffffffffff60);
  local_8 = local_88;
  this_00 = (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
             *)operator_new(0x40,(nothrow_t *)&std::nothrow);
  local_11 = 0;
  if (this_00 !=
      (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
       *)0x0) {
    local_11 = 1;
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
    ::basic_waitable_timer(this_00,in_stack_ffffffffffffff58);
  }
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>>>
  ::
  unique_ptr<std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>>,void>
            ((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
              *)this_00,(pointer)in_stack_ffffffffffffff58);
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::operator=((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
               *)this_00,
              (unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
               *)in_stack_ffffffffffffff58);
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::~unique_ptr((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                 *)in_RDI);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                      *)0x11eda7);
  return bVar1;
}

Assistant:

bool DeliveryChannel::Initialize(DeliveryCommonData* common)
{
    Common = common;

    uint64_t seed = Common->ChannelConfig.Get().RNGSeed;
    if (seed == 0) {
        seed = GetRandomSeed();
    }
    LossRNG.Seed(seed);

    DeliveryTimer = MakeUniqueNoThrow<asio::steady_timer>(*common->Context);
    if (!DeliveryTimer) {
        return false;
    }

    return true;
}